

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quicly.c
# Opt level: O1

quicly_conn_t *
create_connection(quicly_context_t *ctx,uint32_t protocol_version,char *server_name,
                 sockaddr *remote_addr,sockaddr *param_5,ptls_iovec_t *remote_cid,
                 quicly_cid_plaintext_t *param_7,ptls_handshake_properties_t *handshake_properties,
                 uint32_t initcwnd)

{
  st_quicly_default_scheduler_state_t *psVar1;
  anon_struct_48_2_64f3ff10_for_pending_streams *paVar2;
  undefined1 *puVar3;
  ushort uVar4;
  quicly_context_t *pqVar5;
  uint64_t uVar6;
  long lVar7;
  long lVar8;
  st_quicly_init_cc_t *psVar9;
  st_quicly_update_open_count_t *psVar10;
  undefined8 uVar11;
  size_t *psVar12;
  uint8_t *puVar13;
  size_t sVar14;
  undefined8 uVar15;
  void *pvVar16;
  uint8_t *puVar17;
  size_t sVar18;
  ptls_raw_extension_t *ppVar19;
  _func_int_ptls_t_ptr_st_ptls_handshake_properties_t_ptr_uint16_t *p_Var20;
  _func_int_ptls_t_ptr_st_ptls_handshake_properties_t_ptr_ptls_raw_extension_t_ptr *p_Var21;
  int iVar22;
  uint uVar23;
  ptls_t *tls;
  size_t server_name_len;
  quicly_conn_t *conn;
  kh_quicly_stream_t_t *pkVar24;
  quicly_linklist_t *pqVar25;
  void **ppvVar26;
  uint uVar27;
  ulong uVar28;
  long *in_FS_OFFSET;
  ptls_iovec_t *ppVar29;
  undefined1 auVar30 [16];
  size_t sVar32;
  uint8_t *puVar33;
  size_t sVar34;
  undefined1 auVar31 [64];
  undefined1 extraout_var [56];
  
  if ((remote_addr == (sockaddr *)0x0) || (remote_addr->sa_family == 0)) {
    __assert_fail("remote_addr != NULL && remote_addr->sa_family != AF_UNSPEC",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/lib/quicly.c"
                  ,0x7e8,
                  "quicly_conn_t *create_connection(quicly_context_t *, uint32_t, const char *, struct sockaddr *, struct sockaddr *, ptls_iovec_t *, const quicly_cid_plaintext_t *, ptls_handshake_properties_t *, uint32_t)"
                 );
  }
  if (((ctx->transport_params).max_datagram_frame_size != 0) &&
     (ctx->receive_datagram_frame == (quicly_receive_datagram_frame_t *)0x0)) {
    __assert_fail("ctx->receive_datagram_frame != NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/lib/quicly.c"
                  ,0x7ea,
                  "quicly_conn_t *create_connection(quicly_context_t *, uint32_t, const char *, struct sockaddr *, struct sockaddr *, ptls_iovec_t *, const quicly_cid_plaintext_t *, ptls_handshake_properties_t *, uint32_t)"
                 );
  }
  if (server_name == (char *)0x0) {
    tls = ptls_server_new(ctx->tls);
  }
  else {
    tls = ptls_client_new(ctx->tls);
  }
  if (tls == (ptls_t *)0x0) {
    return (quicly_conn_t *)0x0;
  }
  if (server_name != (char *)0x0) {
    server_name_len = strlen(server_name);
    iVar22 = ptls_set_server_name(tls,server_name,server_name_len);
    if (iVar22 != 0) goto LAB_0012297b;
  }
  conn = (quicly_conn_t *)malloc(0x9e8);
  if (conn != (quicly_conn_t *)0x0) {
    uVar28 = (ulong)(server_name == (char *)0x0);
    memset(conn,0,0x9e8);
    (conn->super).ctx = ctx;
    lock_now(conn,0);
    set_address(&(conn->super).local.address,param_5);
    set_address(&(conn->super).remote.address,remote_addr);
    quicly_local_cid_init_set(&(conn->super).local.cid_set,ctx->cid_encryptor,param_7);
    *(undefined8 *)((conn->super).local.long_header_src_cid.cid + 0xd) =
         *(undefined8 *)((conn->super).local.cid_set.cids[0].cid.cid + 0xd);
    uVar11 = *(undefined8 *)((conn->super).local.cid_set.cids[0].cid.cid + 8);
    *(undefined8 *)(conn->super).local.long_header_src_cid.cid =
         *(undefined8 *)(conn->super).local.cid_set.cids[0].cid.cid;
    *(undefined8 *)((conn->super).local.long_header_src_cid.cid + 8) = uVar11;
    quicly_remote_cid_init_set(&(conn->super).remote.cid_set,remote_cid,ctx->tls->random_bytes);
    (conn->super).state = QUICLY_STATE_FIRSTFLIGHT;
    (conn->super).local.bidi.next_stream_id = uVar28;
    (conn->super).local.uni.next_stream_id = uVar28 + 2;
    (conn->super).remote.bidi.next_stream_id = (ulong)(server_name != (char *)0x0);
    (conn->super).remote.uni.next_stream_id = uVar28 ^ 3;
    *(undefined8 *)&(conn->super).remote.transport_params.max_datagram_frame_size = 0;
    (conn->super).remote.transport_params.max_stream_data.bidi_local = 0;
    (conn->super).remote.transport_params.max_stream_data.bidi_remote = 0;
    (conn->super).remote.transport_params.max_stream_data.uni = 0;
    (conn->super).remote.transport_params.max_data = 0;
    (conn->super).remote.transport_params.max_idle_timeout = 0;
    (conn->super).remote.transport_params.max_streams_bidi = 0;
    (conn->super).remote.transport_params.max_streams_uni = 0;
    (conn->super).remote.transport_params.max_udp_payload_size = 0xfff7;
    (conn->super).remote.transport_params.ack_delay_exponent = '\x03';
    (conn->super).remote.transport_params.field_0x41 = 0;
    (conn->super).remote.transport_params.max_ack_delay = 0x19;
    *(undefined4 *)&(conn->super).remote.transport_params.field_0x44 = 0;
    (conn->super).remote.transport_params.min_ack_delay_usec = 0xffffffffffffffff;
    *(undefined8 *)&(conn->super).remote.transport_params.field_0x50 = 0;
    (conn->super).remote.transport_params.active_connection_id_limit = 2;
    (conn->super).version = protocol_version;
    (conn->super).remote.largest_retire_prior_to = 0;
    psVar1 = &(conn->super)._default_scheduler;
    (conn->super)._default_scheduler.active.next = &psVar1->active;
    (conn->super)._default_scheduler.active.prev = &psVar1->active;
    pqVar25 = &(conn->super)._default_scheduler.blocked;
    (conn->super)._default_scheduler.blocked.next = pqVar25;
    (conn->super)._default_scheduler.blocked.prev = pqVar25;
    pkVar24 = (kh_quicly_stream_t_t *)calloc(1,0x28);
    conn->streams = pkVar24;
    pqVar5 = (conn->super).ctx;
    uVar6 = (pqVar5->transport_params).max_data;
    (conn->ingress).max_data.sender.max_committed = uVar6;
    (conn->ingress).max_data.sender.max_acked = uVar6;
    (conn->ingress).max_data.sender.num_inflight = 0;
    puVar3 = &(conn->ingress).max_data.sender.field_0x18;
    *puVar3 = *puVar3 & 0xfe;
    uVar6 = (pqVar5->transport_params).max_streams_uni;
    (conn->ingress).max_streams.uni.max_committed = uVar6;
    (conn->ingress).max_streams.uni.max_acked = uVar6;
    (conn->ingress).max_streams.uni.num_inflight = 0;
    puVar3 = &(conn->ingress).max_streams.uni.field_0x18;
    *puVar3 = *puVar3 & 0xfe;
    uVar6 = (pqVar5->transport_params).max_streams_bidi;
    (conn->ingress).max_streams.bidi.max_committed = uVar6;
    (conn->ingress).max_streams.bidi.max_acked = uVar6;
    (conn->ingress).max_streams.bidi.num_inflight = 0;
    puVar3 = &(conn->ingress).max_streams.bidi.field_0x18;
    *puVar3 = *puVar3 & 0xfe;
    uVar27 = (pqVar5->loss).default_initial_rtt;
    (conn->egress).loss.conf = &pqVar5->loss;
    (conn->egress).loss.max_ack_delay = &(conn->super).remote.transport_params.max_ack_delay;
    (conn->egress).loss.ack_delay_exponent =
         &(conn->super).remote.transport_params.ack_delay_exponent;
    (conn->egress).loss.pto_count = '\0';
    auVar30 = (undefined1  [16])0x0;
    (conn->egress).loss.time_of_last_packet_sent = 0;
    (conn->egress).loss.largest_acked_packet_plus1[0] = 0;
    (conn->egress).loss.largest_acked_packet_plus1[1] = 0;
    (conn->egress).loss.largest_acked_packet_plus1[2] = 0;
    (conn->egress).loss.largest_acked_packet_plus1[1] = 0;
    (conn->egress).loss.largest_acked_packet_plus1[2] = 0;
    (conn->egress).loss.largest_acked_packet_plus1[3] = 0;
    (conn->egress).loss.total_bytes_sent = 0;
    (conn->egress).loss.loss_time = 0x7fffffffffffffff;
    (conn->egress).loss.alarm_at = 0x7fffffffffffffff;
    (conn->egress).loss.rtt.minimum = 0;
    (conn->egress).loss.rtt.smoothed = 0;
    (conn->egress).loss.rtt.variance = 0;
    (conn->egress).loss.rtt.latest = 0;
    (conn->egress).loss.sentmap.head = (st_quicly_sent_block_t *)0x0;
    (conn->egress).loss.sentmap.tail = (st_quicly_sent_block_t *)0x0;
    (conn->egress).loss.sentmap.tail = (st_quicly_sent_block_t *)0x0;
    (conn->egress).loss.sentmap.num_packets = 0;
    (conn->egress).loss.sentmap.bytes_in_flight = 0;
    (conn->egress).loss.sentmap._pending_packet = (quicly_sent_t *)0x0;
    (conn->egress).loss.rtt.minimum = 0xffffffff;
    (conn->egress).loss.rtt.latest = 0;
    (conn->egress).loss.rtt.smoothed = uVar27;
    (conn->egress).loss.rtt.variance = uVar27 >> 1;
    (conn->egress).loss.sentmap._pending_packet = (quicly_sent_t *)0x0;
    (conn->egress).loss.sentmap.head = (st_quicly_sent_block_t *)0x0;
    (conn->egress).loss.sentmap.tail = (st_quicly_sent_block_t *)0x0;
    (conn->egress).loss.sentmap.num_packets = 0;
    (conn->egress).loss.sentmap.bytes_in_flight = 0;
    uVar4 = pqVar5->initial_egress_max_udp_payload_size;
    lVar7 = *in_FS_OFFSET;
    if (in_FS_OFFSET[-1] == 0) {
      auVar31._0_8_ = (*pqVar5->tls->random_bytes)((void *)(lVar7 + -0x28),0x20);
      auVar31._8_56_ = extraout_var;
      auVar30 = auVar31._0_16_;
      in_FS_OFFSET[-1] = 8;
    }
    uVar23 = initcwnd / uVar4;
    uVar27 = 0x20;
    if (0x20 < uVar23) {
      uVar27 = uVar23;
    }
    lVar8 = in_FS_OFFSET[-1];
    in_FS_OFFSET[-1] = lVar8 + -1;
    (conn->egress).next_pn_to_skip =
         (ulong)*(uint *)(lVar7 + -0x2c + lVar8 * 4) % (ulong)(uVar27 << 4) + 1;
    pqVar5 = (conn->super).ctx;
    (conn->egress).max_udp_payload_size = pqVar5->initial_egress_max_udp_payload_size;
    (conn->egress).max_streams.uni.count = 0;
    auVar30 = vpcmpeqd_avx(auVar30,auVar30);
    (conn->egress).max_streams.uni.blocked_sender.max_committed = auVar30._0_8_;
    (conn->egress).max_streams.uni.blocked_sender.max_acked = auVar30._8_8_;
    (conn->egress).max_streams.uni.blocked_sender.num_inflight = 0;
    puVar3 = &(conn->egress).max_streams.uni.blocked_sender.field_0x18;
    *puVar3 = *puVar3 & 0xfe;
    (conn->egress).max_streams.bidi.count = 0;
    (conn->egress).max_streams.bidi.blocked_sender.max_committed = auVar30._0_8_;
    (conn->egress).max_streams.bidi.blocked_sender.max_acked = auVar30._8_8_;
    (conn->egress).max_streams.bidi.blocked_sender.num_inflight = 0;
    puVar3 = &(conn->egress).max_streams.bidi.blocked_sender.field_0x18;
    *puVar3 = *puVar3 & 0xfe;
    (conn->egress).path_challenge.tail_ref = &(conn->egress).path_challenge.head;
    (conn->egress).ack_frequency.update_at = 0x7fffffffffffffff;
    (conn->egress).send_ack_at = 0x7fffffffffffffff;
    psVar9 = pqVar5->init_cc;
    (*psVar9->cb)(psVar9,&(conn->egress).cc,initcwnd,(conn->stash).now);
    quicly_retire_cid_init(&(conn->egress).retire_cid);
    paVar2 = &(conn->egress).pending_streams;
    (conn->egress).pending_streams.blocked.uni.next = (st_quicly_linklist_t *)paVar2;
    (conn->egress).pending_streams.blocked.uni.prev = (st_quicly_linklist_t *)paVar2;
    pqVar25 = &(conn->egress).pending_streams.blocked.bidi;
    (conn->egress).pending_streams.blocked.bidi.next = pqVar25;
    (conn->egress).pending_streams.blocked.bidi.prev = pqVar25;
    pqVar25 = &(conn->egress).pending_streams.control;
    (conn->egress).pending_streams.control.next = pqVar25;
    (conn->egress).pending_streams.control.prev = pqVar25;
    (conn->crypto).tls = tls;
    if (handshake_properties == (ptls_handshake_properties_t *)0x0) {
      ppVar29 = (ptls_iovec_t *)0x0;
      sVar32 = 0;
      puVar33 = (uint8_t *)0x0;
      sVar34 = 0;
      *(undefined8 *)((long)&(conn->crypto).handshake_properties.field_0 + 0x60) = 0;
      (conn->crypto).handshake_properties.additional_extensions = (ptls_raw_extension_t *)0x0;
      (conn->crypto).handshake_properties.collect_extension =
           (_func_int_ptls_t_ptr_st_ptls_handshake_properties_t_ptr_uint16_t *)0x0;
      (conn->crypto).handshake_properties.collected_extensions =
           (_func_int_ptls_t_ptr_st_ptls_handshake_properties_t_ptr_ptls_raw_extension_t_ptr *)0x0;
      *(undefined8 *)((long)&(conn->crypto).handshake_properties.field_0 + 0x40) = 0;
      (conn->crypto).handshake_properties.field_0.server.cookie.key = (void *)0x0;
      (conn->crypto).handshake_properties.field_0.server.cookie.additional_data.base =
           (uint8_t *)0x0;
      (conn->crypto).handshake_properties.field_0.server.cookie.additional_data.len = 0;
      (conn->crypto).handshake_properties.field_0.client.max_early_data_size = (size_t *)0x0;
      *(undefined8 *)((long)&(conn->crypto).handshake_properties.field_0 + 0x28) = 0;
      (conn->crypto).handshake_properties.field_0.client.esni_keys.base = (uint8_t *)0x0;
      (conn->crypto).handshake_properties.field_0.client.esni_keys.len = 0;
    }
    else {
      if (handshake_properties->additional_extensions != (ptls_raw_extension_t *)0x0) {
        __assert_fail("handshake_properties->additional_extensions == NULL",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/lib/quicly.c"
                      ,0x828,
                      "quicly_conn_t *create_connection(quicly_context_t *, uint32_t, const char *, struct sockaddr *, struct sockaddr *, ptls_iovec_t *, const quicly_cid_plaintext_t *, ptls_handshake_properties_t *, uint32_t)"
                     );
      }
      if (handshake_properties->collect_extension !=
          (_func_int_ptls_t_ptr_st_ptls_handshake_properties_t_ptr_uint16_t *)0x0) {
        __assert_fail("handshake_properties->collect_extension == NULL",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/lib/quicly.c"
                      ,0x829,
                      "quicly_conn_t *create_connection(quicly_context_t *, uint32_t, const char *, struct sockaddr *, struct sockaddr *, ptls_iovec_t *, const quicly_cid_plaintext_t *, ptls_handshake_properties_t *, uint32_t)"
                     );
      }
      if (handshake_properties->collected_extensions !=
          (_func_int_ptls_t_ptr_st_ptls_handshake_properties_t_ptr_ptls_raw_extension_t_ptr *)0x0) {
        __assert_fail("handshake_properties->collected_extensions == NULL",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/lib/quicly.c"
                      ,0x82a,
                      "quicly_conn_t *create_connection(quicly_context_t *, uint32_t, const char *, struct sockaddr *, struct sockaddr *, ptls_iovec_t *, const quicly_cid_plaintext_t *, ptls_handshake_properties_t *, uint32_t)"
                     );
      }
      ppVar29 = (handshake_properties->field_0).client.negotiated_protocols.list;
      sVar32 = (handshake_properties->field_0).client.negotiated_protocols.count;
      puVar33 = (handshake_properties->field_0).client.session_ticket.base;
      sVar34 = (handshake_properties->field_0).client.session_ticket.len;
      psVar12 = (handshake_properties->field_0).client.max_early_data_size;
      uVar11 = *(undefined8 *)((long)&handshake_properties->field_0 + 0x28);
      puVar13 = (handshake_properties->field_0).client.esni_keys.base;
      sVar14 = (handshake_properties->field_0).client.esni_keys.len;
      uVar15 = *(undefined8 *)((long)&handshake_properties->field_0 + 0x40);
      pvVar16 = (handshake_properties->field_0).server.cookie.key;
      puVar17 = (handshake_properties->field_0).server.cookie.additional_data.base;
      sVar18 = (handshake_properties->field_0).server.cookie.additional_data.len;
      ppVar19 = handshake_properties->additional_extensions;
      p_Var20 = handshake_properties->collect_extension;
      p_Var21 = handshake_properties->collected_extensions;
      *(undefined8 *)((long)&(conn->crypto).handshake_properties.field_0 + 0x60) =
           *(undefined8 *)((long)&handshake_properties->field_0 + 0x60);
      (conn->crypto).handshake_properties.additional_extensions = ppVar19;
      (conn->crypto).handshake_properties.collect_extension = p_Var20;
      (conn->crypto).handshake_properties.collected_extensions = p_Var21;
      *(undefined8 *)((long)&(conn->crypto).handshake_properties.field_0 + 0x40) = uVar15;
      (conn->crypto).handshake_properties.field_0.server.cookie.key = pvVar16;
      (conn->crypto).handshake_properties.field_0.server.cookie.additional_data.base = puVar17;
      (conn->crypto).handshake_properties.field_0.server.cookie.additional_data.len = sVar18;
      (conn->crypto).handshake_properties.field_0.client.max_early_data_size = psVar12;
      *(undefined8 *)((long)&(conn->crypto).handshake_properties.field_0 + 0x28) = uVar11;
      (conn->crypto).handshake_properties.field_0.client.esni_keys.base = puVar13;
      (conn->crypto).handshake_properties.field_0.client.esni_keys.len = sVar14;
    }
    (conn->crypto).handshake_properties.field_0.client.negotiated_protocols.list = ppVar29;
    (conn->crypto).handshake_properties.field_0.client.negotiated_protocols.count = sVar32;
    (conn->crypto).handshake_properties.field_0.client.session_ticket.base = puVar33;
    (conn->crypto).handshake_properties.field_0.client.session_ticket.len = sVar34;
    (conn->crypto).handshake_properties.collect_extension = collect_transport_parameters;
    (conn->retry_scid).len = 0xff;
    (conn->idle_timeout).at = 0x7fffffffffffffff;
    puVar3 = &(conn->idle_timeout).field_0x8;
    *puVar3 = *puVar3 | 1;
    (conn->stash).on_ack_stream.active_acked_cache.stream_id = -0x8000000000000000;
    ppvVar26 = ptls_get_data_ptr(tls);
    *ppvVar26 = conn;
    psVar10 = ((conn->super).ctx)->update_open_count;
    if (psVar10 != (st_quicly_update_open_count_t *)0x0) {
      (*psVar10->cb)(psVar10,1);
      return conn;
    }
    return conn;
  }
LAB_0012297b:
  ptls_free(tls);
  return (quicly_conn_t *)0x0;
}

Assistant:

static quicly_conn_t *create_connection(quicly_context_t *ctx, uint32_t protocol_version, const char *server_name,
                                        struct sockaddr *remote_addr, struct sockaddr *local_addr, ptls_iovec_t *remote_cid,
                                        const quicly_cid_plaintext_t *local_cid, ptls_handshake_properties_t *handshake_properties,
                                        uint32_t initcwnd)
{
    ptls_t *tls = NULL;
    quicly_conn_t *conn;

    /* consistency checks */
    assert(remote_addr != NULL && remote_addr->sa_family != AF_UNSPEC);
    if (ctx->transport_params.max_datagram_frame_size != 0)
        assert(ctx->receive_datagram_frame != NULL);

    /* create TLS context */
    if ((tls = ptls_new(ctx->tls, server_name == NULL)) == NULL)
        return NULL;
    if (server_name != NULL && ptls_set_server_name(tls, server_name, strlen(server_name)) != 0) {
        ptls_free(tls);
        return NULL;
    }

    /* allocate memory and start creating QUIC context */
    if ((conn = malloc(sizeof(*conn))) == NULL) {
        ptls_free(tls);
        return NULL;
    }
    memset(conn, 0, sizeof(*conn));
    conn->super.ctx = ctx;
    lock_now(conn, 0);
    set_address(&conn->super.local.address, local_addr);
    set_address(&conn->super.remote.address, remote_addr);
    quicly_local_cid_init_set(&conn->super.local.cid_set, ctx->cid_encryptor, local_cid);
    conn->super.local.long_header_src_cid = conn->super.local.cid_set.cids[0].cid;
    quicly_remote_cid_init_set(&conn->super.remote.cid_set, remote_cid, ctx->tls->random_bytes);
    conn->super.state = QUICLY_STATE_FIRSTFLIGHT;
    if (server_name != NULL) {
        conn->super.local.bidi.next_stream_id = 0;
        conn->super.local.uni.next_stream_id = 2;
        conn->super.remote.bidi.next_stream_id = 1;
        conn->super.remote.uni.next_stream_id = 3;
    } else {
        conn->super.local.bidi.next_stream_id = 1;
        conn->super.local.uni.next_stream_id = 3;
        conn->super.remote.bidi.next_stream_id = 0;
        conn->super.remote.uni.next_stream_id = 2;
    }
    conn->super.remote.transport_params = default_transport_params;
    conn->super.version = protocol_version;
    conn->super.remote.largest_retire_prior_to = 0;
    quicly_linklist_init(&conn->super._default_scheduler.active);
    quicly_linklist_init(&conn->super._default_scheduler.blocked);
    conn->streams = kh_init(quicly_stream_t);
    quicly_maxsender_init(&conn->ingress.max_data.sender, conn->super.ctx->transport_params.max_data);
    quicly_maxsender_init(&conn->ingress.max_streams.uni, conn->super.ctx->transport_params.max_streams_uni);
    quicly_maxsender_init(&conn->ingress.max_streams.bidi, conn->super.ctx->transport_params.max_streams_bidi);
    quicly_loss_init(&conn->egress.loss, &conn->super.ctx->loss,
                     conn->super.ctx->loss.default_initial_rtt /* FIXME remember initial_rtt in session ticket */,
                     &conn->super.remote.transport_params.max_ack_delay, &conn->super.remote.transport_params.ack_delay_exponent);
    conn->egress.next_pn_to_skip =
        calc_next_pn_to_skip(conn->super.ctx->tls, 0, initcwnd, conn->super.ctx->initial_egress_max_udp_payload_size);
    conn->egress.max_udp_payload_size = conn->super.ctx->initial_egress_max_udp_payload_size;
    init_max_streams(&conn->egress.max_streams.uni);
    init_max_streams(&conn->egress.max_streams.bidi);
    conn->egress.path_challenge.tail_ref = &conn->egress.path_challenge.head;
    conn->egress.ack_frequency.update_at = INT64_MAX;
    conn->egress.send_ack_at = INT64_MAX;
    conn->super.ctx->init_cc->cb(conn->super.ctx->init_cc, &conn->egress.cc, initcwnd, conn->stash.now);
    quicly_retire_cid_init(&conn->egress.retire_cid);
    quicly_linklist_init(&conn->egress.pending_streams.blocked.uni);
    quicly_linklist_init(&conn->egress.pending_streams.blocked.bidi);
    quicly_linklist_init(&conn->egress.pending_streams.control);
    conn->crypto.tls = tls;
    if (handshake_properties != NULL) {
        assert(handshake_properties->additional_extensions == NULL);
        assert(handshake_properties->collect_extension == NULL);
        assert(handshake_properties->collected_extensions == NULL);
        conn->crypto.handshake_properties = *handshake_properties;
    } else {
        conn->crypto.handshake_properties = (ptls_handshake_properties_t){{{{NULL}}}};
    }
    conn->crypto.handshake_properties.collect_extension = collect_transport_parameters;
    conn->retry_scid.len = UINT8_MAX;
    conn->idle_timeout.at = INT64_MAX;
    conn->idle_timeout.should_rearm_on_send = 1;
    conn->stash.on_ack_stream.active_acked_cache.stream_id = INT64_MIN;

    *ptls_get_data_ptr(tls) = conn;

    update_open_count(conn->super.ctx, 1);

    return conn;
}